

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O0

void __thiscall
TPZEulerAnalysis::TPZEulerAnalysis(TPZEulerAnalysis *this,TPZFlowCompMesh *mesh,ostream *out)

{
  undefined8 in_RDX;
  TPZCompMesh *in_RSI;
  void **in_RDI;
  TPZLinearAnalysis *unaff_retaddr;
  ostream *in_stack_ffffffffffffffe0;
  
  TPZLinearAnalysis::TPZLinearAnalysis
            (unaff_retaddr,in_RDI,in_RSI,SUB81((ulong)in_RDX >> 0x38,0),in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__TPZEulerAnalysis_0252dc10;
  in_RDI[0x91] = in_RSI;
  TPZFMatrix<double>::TPZFMatrix((TPZFMatrix<double> *)unaff_retaddr);
  in_RDI[0xa4] = (void *)0x3e112e0be826d695;
  *(undefined4 *)(in_RDI + 0xa5) = 10;
  in_RDI[0xa6] = (void *)0x3e45798ee2308c3a;
  *(undefined4 *)(in_RDI + 0xa7) = 100;
  *(undefined4 *)((long)in_RDI + 0x53c) = 0;
  in_RDI[0xa8] = (void *)0x0;
  *(undefined4 *)((long)in_RDI + 0x54c) = 0;
  return;
}

Assistant:

TPZEulerAnalysis::TPZEulerAnalysis(TPZFlowCompMesh *mesh, std::ostream &out):
TPZLinearAnalysis(mesh, true, out), fFlowCompMesh(mesh),
fRhsLast(),
fNewtonEps(1e-9),  fNewtonMaxIter(10),
fTimeIntEps(1e-8), fTimeIntMaxIter(100),
fEvolCFL(0), fpBlockDiag(NULL),fHasFrontalPreconditioner(0)
{
	
}